

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
          (Proxy_Function_Impl_Base *this,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_30,t_types);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,&local_30,
             (int)((ulong)((long)(t_types->
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(t_types->
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1
            );
  if (local_30.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_003cff68;
  return;
}

Assistant:

explicit Proxy_Function_Impl_Base(const std::vector<Type_Info> &t_types)
          : Proxy_Function_Base(t_types, static_cast<int>(t_types.size()) - 1) {
      }